

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O1

void MOJOSHADER_glBindShaders(MOJOSHADER_glShader *v,MOJOSHADER_glShader *p)

{
  int iVar1;
  HashTable *pHVar2;
  MOJOSHADER_glProgram *program;
  undefined8 *key;
  void *val;
  BoundShaders shaders;
  MOJOSHADER_glProgram *local_28;
  MOJOSHADER_glShader *local_20;
  MOJOSHADER_glShader *pMStack_18;
  
  if (v == (MOJOSHADER_glShader *)0x0 && p == (MOJOSHADER_glShader *)0x0) {
    MOJOSHADER_glBindProgram((MOJOSHADER_glProgram *)0x0);
    return;
  }
  if (ctx->linker_cache == (HashTable *)0x0) {
    pHVar2 = hash_create((void *)0x0,hash_shaders,match_shaders,nuke_shaders,0,ctx->malloc_fn,
                         ctx->free_fn,ctx->malloc_data);
    ctx->linker_cache = pHVar2;
    if (pHVar2 != (HashTable *)0x0) goto LAB_00127fa8;
LAB_00128062:
    builtin_strncpy(error_buffer + 8,"emory",6);
    builtin_strncpy(error_buffer,"out of m",8);
  }
  else {
LAB_00127fa8:
    local_28 = (MOJOSHADER_glProgram *)0x0;
    local_20 = v;
    pMStack_18 = p;
    iVar1 = hash_find(ctx->linker_cache,&local_20,&local_28);
    program = local_28;
    if (iVar1 == 0) {
      program = MOJOSHADER_glLinkProgram(v,p);
      if (program == (MOJOSHADER_glProgram *)0x0) {
        return;
      }
      key = (undefined8 *)(*ctx->malloc_fn)(0x10,ctx->malloc_data);
      if (key == (undefined8 *)0x0) {
        builtin_strncpy(error_buffer + 8,"emory",6);
        builtin_strncpy(error_buffer,"out of m",8);
        program_unref(program);
        return;
      }
      *key = local_20;
      key[1] = pMStack_18;
      iVar1 = hash_insert(ctx->linker_cache,key,program);
      if (iVar1 != 1) {
        (*ctx->free_fn)(key,ctx->malloc_data);
        program_unref(program);
        goto LAB_00128062;
      }
    }
    if (program == (MOJOSHADER_glProgram *)0x0) {
      __assert_fail("program != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                    ,0x83d,
                    "void MOJOSHADER_glBindShaders(MOJOSHADER_glShader *, MOJOSHADER_glShader *)");
    }
    MOJOSHADER_glBindProgram(program);
  }
  return;
}

Assistant:

void MOJOSHADER_glBindShaders(MOJOSHADER_glShader *v, MOJOSHADER_glShader *p)
{
    if ((v == NULL) && (p == NULL))
    {
        MOJOSHADER_glBindProgram(NULL);
        return;
    } // if

    // !!! FIXME: eventually support GL_EXT_separate_shader_objects.
    if (ctx->linker_cache == NULL)
    {
        ctx->linker_cache = hash_create(NULL, hash_shaders, match_shaders,
                                        nuke_shaders, 0, ctx->malloc_fn,
                                        ctx->free_fn, ctx->malloc_data);

        if (ctx->linker_cache == NULL)
        {
            out_of_memory();
            return;
        } // if
    } // if

    MOJOSHADER_glProgram *program = NULL;
    BoundShaders shaders;
    shaders.vertex = v;
    shaders.fragment = p;

    const void *val = NULL;
    if (hash_find(ctx->linker_cache, &shaders, &val))
        program = (MOJOSHADER_glProgram *) val;
    else
    {
        program = MOJOSHADER_glLinkProgram(v, p);
        if (program == NULL)
            return;

        BoundShaders *item = (BoundShaders *) Malloc(sizeof (BoundShaders));
        if (item == NULL)
        {
            MOJOSHADER_glDeleteProgram(program);
            return;
        } // if

        memcpy(item, &shaders, sizeof (BoundShaders));
        if (hash_insert(ctx->linker_cache, item, program) != 1)
        {
            Free(item);
            MOJOSHADER_glDeleteProgram(program);
            out_of_memory();
            return;
        } // if
    } // else

    assert(program != NULL);
    MOJOSHADER_glBindProgram(program);
}